

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ShowStackToolWindow(bool *p_open)

{
  ImVector<ImGuiStackLevelInfo> *this;
  ImVec2 IVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImU32 color;
  ImGuiStackLevelInfo *pIVar4;
  ImGuiWindow *pIVar5;
  char *text;
  int n;
  int i;
  ImVec2 local_38;
  
  bVar3 = Begin("Dear ImGui Stack Tool",p_open,0);
  pIVar2 = GImGui;
  if ((!bVar3) ||
     (pIVar5 = GImGui->CurrentWindow, pIVar5->WriteAccessed = true, 1 < pIVar5->BeginCount)) {
    End();
    return;
  }
  Text("HoveredId: 0x%08X, ActiveId:  0x%08X",(ulong)pIVar2->HoveredIdPreviousFrame,
       (ulong)pIVar2->ActiveId);
  SameLine(0.0,-1.0);
  MetricsHelpMarker(
                   "Hover an item with the mouse to display elements of the ID Stack leading to the item\'s final ID.\nEach level of the stack correspond to a PushID() call.\nAll levels of the stack are hashed together to make the final ID of a widget (ID displayed at the bottom level of the stack).\nRead FAQ entry about the ID stack for details."
                   );
  (pIVar2->DebugStackTool).LastActiveFrame = pIVar2->FrameCount;
  if (0 < (pIVar2->DebugStackTool).Results.Size) {
    local_38.x = 0.0;
    local_38.y = 0.0;
    bVar3 = BeginTable("##table",3,0x780,&local_38,0.0);
    if (bVar3) {
      this = &(pIVar2->DebugStackTool).Results;
      IVar1 = CalcTextSize("0xDDDDDDDD",(char *)0x0,false,-1.0);
      TableSetupColumn("Seed",0x10,IVar1.x,0);
      TableSetupColumn("PushID",8,0.0,0);
      TableSetupColumn("Result",0x10,IVar1.x,0);
      TableHeadersRow();
      for (i = 0; i < this->Size; i = i + 1) {
        pIVar4 = ImVector<ImGuiStackLevelInfo>::operator[](this,i);
        TableNextColumn();
        if (i != 0) {
          ImVector<ImGuiStackLevelInfo>::operator[](this,i + -1);
        }
        Text("0x%08X");
        TableNextColumn();
        if (((i == 0) && (pIVar4->Desc[0] == '\0')) &&
           (pIVar5 = FindWindowByID(pIVar4->ID), pIVar5 != (ImGuiWindow *)0x0)) {
          Text("\"%s\" [window]",pIVar5->Name);
        }
        else {
          if (pIVar4->QuerySuccess == true) {
            text = pIVar4->Desc;
          }
          else {
            if ((pIVar2->DebugStackTool).StackLevel < (pIVar2->DebugStackTool).Results.Size)
            goto LAB_00143a55;
            text = "???";
          }
          TextUnformatted(text,(char *)0x0);
        }
LAB_00143a55:
        TableNextColumn();
        Text("0x%08X",(ulong)pIVar4->ID);
        if (i == this->Size + -1) {
          color = GetColorU32(0x18,1.0);
          TableSetBgColor(3,color,-1);
        }
      }
      EndTable();
    }
  }
  End();
  return;
}

Assistant:

void ImGui::ShowStackToolWindow(bool* p_open)
{
    if (!Begin("Dear ImGui Stack Tool", p_open) || GetCurrentWindow()->BeginCount > 1)
    {
        End();
        return;
    }

    // Display hovered/active status
    ImGuiContext& g = *GImGui;
    const ImGuiID hovered_id = g.HoveredIdPreviousFrame;
    const ImGuiID active_id = g.ActiveId;
#ifdef IMGUI_ENABLE_TEST_ENGINE
    Text("HoveredId: 0x%08X (\"%s\"), ActiveId:  0x%08X (\"%s\")", hovered_id, hovered_id ? ImGuiTestEngine_FindItemDebugLabel(&g, hovered_id) : "", active_id, active_id ? ImGuiTestEngine_FindItemDebugLabel(&g, active_id) : "");
#else
    Text("HoveredId: 0x%08X, ActiveId:  0x%08X", hovered_id, active_id);
#endif
    SameLine();
    MetricsHelpMarker("Hover an item with the mouse to display elements of the ID Stack leading to the item's final ID.\nEach level of the stack correspond to a PushID() call.\nAll levels of the stack are hashed together to make the final ID of a widget (ID displayed at the bottom level of the stack).\nRead FAQ entry about the ID stack for details.");

    // Display decorated stack
    ImGuiStackTool* tool = &g.DebugStackTool;
    tool->LastActiveFrame = g.FrameCount;
    if (tool->Results.Size > 0 && BeginTable("##table", 3, ImGuiTableFlags_Borders))
    {
        const float id_width = CalcTextSize("0xDDDDDDDD").x;
        TableSetupColumn("Seed", ImGuiTableColumnFlags_WidthFixed, id_width);
        TableSetupColumn("PushID", ImGuiTableColumnFlags_WidthStretch);
        TableSetupColumn("Result", ImGuiTableColumnFlags_WidthFixed, id_width);
        TableHeadersRow();
        for (int n = 0; n < tool->Results.Size; n++)
        {
            ImGuiStackLevelInfo* info = &tool->Results[n];
            TableNextColumn();
            Text("0x%08X", (n > 0) ? tool->Results[n - 1].ID : 0);

            TableNextColumn();
            ImGuiWindow* window = (info->Desc[0] == 0 && n == 0) ? FindWindowByID(info->ID) : NULL;
            if (window)                                         // Source: window name (because the root ID don't call GetID() and so doesn't get hooked)
                Text("\"%s\" [window]", window->Name);
            else if (info->QuerySuccess)                        // Source: GetID() hooks (prioritize over ItemInfo() because we frequently use patterns like: PushID(str), Button("") where they both have same id)
                TextUnformatted(info->Desc);
            else if (tool->StackLevel >= tool->Results.Size)    // Only start using fallback below when all queries are done, so during queries we don't flickering ??? markers.
            {
#ifdef IMGUI_ENABLE_TEST_ENGINE
                if (const char* label = ImGuiTestEngine_FindItemDebugLabel(&g, info->ID))    // Source: ImGuiTestEngine's ItemInfo()
                    Text("??? \"%s\"", label);
                else
#endif
                    TextUnformatted("???");
            }

            TableNextColumn();
            Text("0x%08X", info->ID);
            if (n == tool->Results.Size - 1)
                TableSetBgColor(ImGuiTableBgTarget_CellBg, GetColorU32(ImGuiCol_Header));
        }
        EndTable();
    }
    End();
}